

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O1

void NULLCCanvas::CanvasCommit(Canvas *ptr)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  if (ptr != (Canvas *)0x0) {
    lVar3 = (long)ptr->height * (long)ptr->width;
    if ((int)lVar3 != 0) {
      pcVar1 = (ptr->dataI).ptr;
      pcVar2 = (ptr->data).ptr;
      lVar4 = 0;
      do {
        fVar5 = *(float *)(pcVar2 + lVar4 * 4) * 255.0;
        fVar8 = 255.0;
        if (fVar5 <= 255.0) {
          fVar8 = fVar5;
        }
        fVar6 = *(float *)(pcVar2 + lVar4 * 4 + 4) * 255.0;
        fVar9 = 255.0;
        if (fVar6 <= 255.0) {
          fVar9 = fVar6;
        }
        fVar7 = *(float *)(pcVar2 + lVar4 * 4 + 8) * 255.0;
        fVar10 = 255.0;
        if (fVar7 <= 255.0) {
          fVar10 = fVar7;
        }
        *(uint *)(pcVar1 + lVar4) =
             (int)(float)(~-(uint)(fVar6 < 0.0) & (uint)fVar9) << 8 |
             (int)(float)(~-(uint)(fVar5 < 0.0) & (uint)fVar8) << 0x10 |
             (int)(float)(~-(uint)(fVar7 < 0.0) & (uint)fVar10) | 0xff000000;
        lVar4 = lVar4 + 4;
      } while (lVar3 * 4 != lVar4);
    }
    return;
  }
  nullcThrowError("ERROR: Canvas object is nullptr");
  return;
}

Assistant:

void CanvasCommit(Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		int *pStart = (int*)ptr->dataI.ptr, *pEnd = (int*)ptr->dataI.ptr + ptr->width * ptr->height;
		float *fStart = (float*)ptr->data.ptr;
		for(int *pix = pStart; pix != pEnd; pix++)
		{
			int red = int(saturate(*fStart++ * 255.0f));
			int green = int(saturate(*fStart++ * 255.0f));
			int blue = int(saturate(*fStart++ * 255.0f));
			fStart++;

			*pix = (red << 16) | (green << 8) | (blue) | (255 << 24);
		}
	}